

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void removeFile(string *path)

{
  int iVar1;
  int iVar2;
  dir_block *pdVar3;
  char *__s2;
  ostream *poVar4;
  string *local_df8;
  string *local_d78;
  dir_entry *temp;
  int i;
  dir_block *parent;
  int local_d34;
  inode *piStack_d30;
  int parentid;
  inode *q;
  File_Block *p;
  string local_d18 [4];
  int size;
  int local_cf4;
  string local_cf0 [4];
  int id;
  int local_cd0;
  int legal_layers;
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers;
  string asStack_18 [8];
  string *local_10;
  string *path_local;
  
  local_d78 = local_c98;
  local_10 = path;
  do {
    std::__cxx11::string::string(local_d78);
    local_d78 = local_d78 + 0x20;
  } while (local_d78 != asStack_18);
  std::__cxx11::string::string(local_cc0,(string *)path);
  iVar1 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar1;
  std::__cxx11::string::string(local_cf0,(string *)path);
  iVar2 = getPathType((string *)local_cf0);
  iVar2 = doesExist((string *)local_c98,iVar1,iVar2 == 2);
  std::__cxx11::string::~string(local_cf0);
  iVar1 = local_c9c;
  local_cd0 = iVar2;
  if (iVar2 == local_c9c) {
    std::__cxx11::string::string(local_d18,(string *)path);
    iVar2 = getPathType((string *)local_d18);
    iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
    std::__cxx11::string::~string(local_d18);
    p._4_4_ = inodes[iVar1].i_file_size;
    local_cf4 = iVar1;
    q = (inode *)getAddressByLocation_File(inodes[iVar1].i_blocks[0]);
    piStack_d30 = inodes + local_cf4;
    super_block.inode_bitmap[local_cf4] = false;
    super_block.block_bitmap[inodes[local_cf4].i_blocks[0]] = false;
    memset(q,0,0x1000);
    piStack_d30->i_place_holder[0] = '\0';
    piStack_d30->i_place_holder[1] = '\0';
    piStack_d30->i_place_holder[2] = '\0';
    piStack_d30->i_place_holder[3] = '\0';
    piStack_d30->i_place_holder[4] = '\0';
    piStack_d30->i_place_holder[5] = '\0';
    piStack_d30->i_place_holder[6] = '\0';
    piStack_d30->i_place_holder[7] = '\0';
    piStack_d30->i_place_holder[8] = '\0';
    piStack_d30->i_place_holder[9] = '\0';
    piStack_d30->i_place_holder[10] = '\0';
    piStack_d30->i_place_holder[0xb] = '\0';
    piStack_d30->i_place_holder[0xc] = '\0';
    piStack_d30->i_place_holder[0xd] = '\0';
    piStack_d30->i_place_holder[0xe] = '\0';
    piStack_d30->i_place_holder[0xf] = '\0';
    piStack_d30->i_id = 0;
    piStack_d30->i_mode = 0;
    piStack_d30->i_file_size = 0;
    piStack_d30->i_blocks[0] = 0;
    iVar1 = local_c9c + -1;
    std::__cxx11::string::string((string *)&parent,(string *)path);
    iVar2 = getPathType((string *)&parent);
    iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
    std::__cxx11::string::~string((string *)&parent);
    local_d34 = iVar1;
    pdVar3 = getAddressByLocation_Folder(inodes[iVar1].i_blocks[0]);
    for (temp._4_4_ = 0; temp._4_4_ < 0x10; temp._4_4_ = temp._4_4_ + 1) {
      __s2 = (char *)std::__cxx11::string::c_str();
      iVar1 = strcmp(pdVar3->dirs[temp._4_4_].name,__s2);
      if (iVar1 == 0) {
        memset(pdVar3->dirs + temp._4_4_,0,0x100);
        break;
      }
    }
    inodes[local_d34].i_file_size = inodes[local_d34].i_file_size - p._4_4_;
    while (local_d34 != 0) {
      local_d34 = getParentById(local_d34);
      inodes[local_d34].i_file_size = inodes[local_d34].i_file_size - p._4_4_;
    }
  }
  else {
    setColor(3);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar4,": No such file or directory.\n");
    setColor(2);
  }
  local_df8 = asStack_18;
  do {
    local_df8 = local_df8 + -0x20;
    std::__cxx11::string::~string(local_df8);
  } while (local_df8 != local_c98);
  return;
}

Assistant:

void removeFile(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        int size = inodes[id].i_file_size;
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(File_Block));
        memset(q, '\0', sizeof(inode));
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到母文件夹
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
        inodes[parentid].i_file_size -= size;
        while(parentid != 0){
            parentid = getParentById(parentid);
            inodes[parentid].i_file_size -= size;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << path << ": No such file or directory.\n";
        setColor(COLOR_ORIGIN);
    }
}